

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genkat.c
# Opt level: O2

int main(int argc,char **argv)

{
  int extraout_EAX;
  char *pcVar1;
  ulong uVar2;
  undefined4 uVar3;
  uchar secret [8];
  undefined8 local_e8;
  undefined4 local_e0;
  uchar salt [16];
  uchar pwd [32];
  uchar out [32];
  uchar *local_80;
  undefined4 local_78;
  uchar *local_70;
  undefined4 local_68;
  uchar *local_60;
  undefined4 local_58;
  uchar *local_50;
  undefined4 local_48;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  int local_24;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  if (argc < 2) {
    pcVar1 = "i";
  }
  else {
    pcVar1 = argv[1];
  }
  if (*pcVar1 == 'i') {
    if (pcVar1[1] == '\0') {
      uVar3 = 1;
    }
    else {
      if ((pcVar1[1] != 'd') || (pcVar1[2] != '\0')) goto LAB_001012a3;
      uVar3 = 2;
    }
  }
  else if ((*pcVar1 != 'd') || (uVar3 = 0, pcVar1[1] != '\0')) {
LAB_001012a3:
    fatal("wrong Argon2 type");
    return extraout_EAX;
  }
  if (2 < argc) {
    uVar2 = strtoul(argv[2],(char **)0x0,10);
    local_24 = (int)uVar2;
    if ((local_24 == 0x10) || (local_24 == 0x13)) goto LAB_001011f1;
    fatal("wrong Argon2 version number");
  }
  local_24 = 0x13;
LAB_001011f1:
  local_70 = pwd;
  builtin_memcpy(pwd,
                 "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                 ,0x20);
  local_60 = salt;
  builtin_memcpy(salt,"\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02",0x10);
  local_50 = secret;
  builtin_memcpy(secret,"\x03\x03\x03\x03\x03\x03\x03\x03",8);
  local_40 = &local_e8;
  local_e8 = 0x404040404040404;
  local_e0 = 0x4040404;
  local_80 = out;
  local_78 = 0x20;
  local_58 = 0x10;
  local_48 = 8;
  local_38 = 0x30000000c;
  uStack_30 = 0x400000020;
  local_28 = 4;
  local_20 = 0;
  uStack_18 = 0;
  local_68 = local_78;
  local_10 = local_48;
  argon2_ctx(&local_80,uVar3);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    /* Get and check Argon2 type */
    const char *type_str = (argc > 1) ? argv[1] : "i";
    argon2_type type = Argon2_i;
    uint32_t version = ARGON2_VERSION_NUMBER;
    if (!strcmp(type_str, "d")) {
        type = Argon2_d;
    } else if (!strcmp(type_str, "i")) {
        type = Argon2_i;
    } else if (!strcmp(type_str, "id")) {
        type = Argon2_id;
    } else {
        fatal("wrong Argon2 type");
    }

    /* Get and check Argon2 version number */
    if(argc > 2) {
        version = strtoul(argv[2], NULL, 10);
    }
    if (ARGON2_VERSION_10 != version && ARGON2_VERSION_NUMBER != version) {
        fatal("wrong Argon2 version number");
    }

    generate_testvectors(type, version);
    return ARGON2_OK;
}